

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRow(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newRow,bool scale)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  
  pcVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
  uVar1 = *(undefined8 *)((pcVar5->data)._M_elems + 2);
  uVar2 = *(undefined8 *)((pcVar5->data)._M_elems + 4);
  uVar3 = *(undefined8 *)((pcVar5->data)._M_elems + 6);
  *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
       *(undefined8 *)(pcVar5->data)._M_elems;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
       *(undefined8 *)((pcVar5->data)._M_elems + 8);
  (this->m_nonbasicValue).m_backend.exp = pcVar5->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar5->neg;
  iVar4 = pcVar5->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar5->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar4;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeRow(&this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,i,newRow,scale);
  if (NO_PROBLEM <
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::invalidate(&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::restoreInitialBasis
              (&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  }
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x77])(this);
  return;
}

Assistant:

void SPxSolverBase<R>::changeRow(int i, const LPRowBase<R>& newRow, bool scale)
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeRow(i, newRow, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      SPxBasisBase<R>::changedRow(i);

   unInit();
}